

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

VectorXd __thiscall util::argmax(util *this,MatrixXd *m,int axis)

{
  long size;
  double *pdVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  double *extraout_RDX;
  double *pdVar5;
  double *extraout_RDX_00;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  VectorXd VVar12;
  max_coeff_visitor<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  maxVisitor;
  double *local_80 [2];
  long local_70;
  MatrixXd *local_68;
  long local_60;
  undefined8 local_58;
  undefined8 local_50;
  max_coeff_visitor<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_48;
  
  size = (&(m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows)
         [axis != 0];
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  if (size < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/PlainObjectBase.h"
                  ,0x138,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,size,size,1);
  pdVar5 = extraout_RDX;
  if (size != 0) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      if (axis == 0) {
        pdVar5 = (m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        local_70 = (m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_cols;
        local_80[0] = pdVar5 + lVar8;
        if (local_70 < 0 && pdVar5 != (double *)0x0) {
          pcVar4 = 
          "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
          ;
          goto LAB_0011bfaf;
        }
        local_58 = 0;
        local_50 = 1;
        local_68 = m;
        local_60 = lVar8;
        if ((m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
            <= lVar8) {
          pcVar4 = 
          "Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
          ;
          goto LAB_0011bf90;
        }
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>>::
        visit<Eigen::internal::max_coeff_visitor<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>>
                  ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>> *)
                   local_80,&local_48);
        lVar3 = local_48.
                super_coeff_visitor<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                .col;
        pdVar5 = extraout_RDX_00;
      }
      else {
        pdVar1 = (m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        lVar2 = (m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows;
        pdVar5 = (double *)CONCAT71((int7)((ulong)pdVar5 >> 8),pdVar1 == (double *)0x0);
        if (lVar2 < 0 && pdVar1 != (double *)0x0) {
          pcVar4 = 
          "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
          ;
LAB_0011bfaf:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/MapBase.h"
                        ,0xb0,pcVar4);
        }
        if ((m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
            <= lVar8) {
          pcVar4 = 
          "Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
          ;
LAB_0011bf90:
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Block.h"
                        ,0x7a,pcVar4);
        }
        if (lVar2 < 2) {
          lVar3 = 0;
        }
        else {
          uVar9 = SUB84(pdVar1[lVar2 * lVar8],0);
          uVar10 = (undefined4)((ulong)pdVar1[lVar2 * lVar8] >> 0x20);
          pdVar5 = (double *)(lVar2 * lVar7 + (long)pdVar1);
          lVar6 = 1;
          lVar3 = 0;
          do {
            dVar11 = pdVar5[lVar6];
            if ((double)CONCAT44(uVar10,uVar9) <= dVar11 && dVar11 != (double)CONCAT44(uVar10,uVar9)
               ) {
              lVar3 = lVar6;
            }
            if (dVar11 <= (double)CONCAT44(uVar10,uVar9)) {
              dVar11 = (double)CONCAT44(uVar10,uVar9);
            }
            lVar6 = lVar6 + 1;
            uVar9 = SUB84(dVar11,0);
            uVar10 = (undefined4)((ulong)dVar11 >> 0x20);
          } while (lVar2 != lVar6);
        }
      }
      if (*(long *)(this + 8) <= lVar8) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x198,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      *(double *)(*(long *)this + lVar8 * 8) = (double)lVar3;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 8;
    } while (lVar8 != size);
  }
  VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)pdVar5;
  VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd argmax(const Eigen::MatrixXd& m, int axis) {
		using namespace Eigen;

		const bool _rowwise = (axis == 0);

		size_t _len = _rowwise ? m.rows() : m.cols();
		VectorXd _indices(_len);

		Index ind = -1;
		for (int i = 0; i < _len; i++) {
			if (_rowwise)
				m.row(i).maxCoeff(&ind);
			else
				m.col(i).maxCoeff(&ind);
			_indices[i] = static_cast<double>(ind);
		}

		return _indices;
	}